

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayout::~QMainWindowLayout(QMainWindowLayout *this)

{
  QMainWindowLayout *in_stack_00000010;
  
  ~QMainWindowLayout(in_stack_00000010);
  return;
}

Assistant:

QMainWindowLayout::~QMainWindowLayout()
{
    layoutState.deleteAllLayoutItems();
    layoutState.deleteCentralWidgetItem();

    delete statusbar;

#if QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget)
    // unusedTabBars contains unparented tab bars, which need to be removed manually.
    // ~QMainWindowTabBar() attempts to remove the bar from unusedTabBars
    // => move it out of the way first.
    const auto bars = std::move(unusedTabBars);
    qDeleteAll(bars);
#endif // QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget)
}